

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugallocation.cc
# Opt level: O3

MallocBlockQueueEntry * __thiscall
FreeQueue<MallocBlockQueueEntry>::Pop
          (MallocBlockQueueEntry *__return_storage_ptr__,FreeQueue<MallocBlockQueueEntry> *this)

{
  int iVar1;
  uint uVar2;
  
  iVar1 = this->q_back_;
  if (iVar1 != this->q_front_) {
    uVar2 = iVar1 + 0x400;
    if (-1 < (int)(iVar1 + 1U)) {
      uVar2 = iVar1 + 1U;
    }
    this->q_back_ = (iVar1 - (uVar2 & 0xfffffc00)) + 1;
    memcpy(__return_storage_ptr__,this->q_ + iVar1,0xa0);
    return __return_storage_ptr__;
  }
  syscall(1,2,"Check failed: q_back_ != q_front_: Queue is empty\n",0x32);
  abort();
}

Assistant:

QueueEntry Pop() {
    RAW_CHECK(q_back_ != q_front_, "Queue is empty");
    const QueueEntry& ret = q_[q_back_];
    q_back_ = (q_back_ + 1) % kFreeQueueSize;
    return ret;
  }